

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

void FromWabtValueTypes(ValueTypes *types,wasm_valtype_vec_t *out)

{
  wasm_valkind_t kind;
  ValueType VVar1;
  pointer pTVar2;
  wasm_valtype_t *pwVar3;
  ulong uVar4;
  
  wasm_valtype_vec_new_uninitialized
            (out,(long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2);
  pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_finish != pTVar2) {
    uVar4 = 0;
    do {
      kind = FromWabtValueType((ValueType)pTVar2[uVar4].enum_);
      pwVar3 = (wasm_valtype_t *)operator_new(4);
      VVar1 = ToWabtValueType(kind);
      (pwVar3->I).enum_ = VVar1.enum_;
      out->data[uVar4] = pwVar3;
      uVar4 = uVar4 + 1;
      pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(types->
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 2));
  }
  return;
}

Assistant:

static void FromWabtValueTypes(const ValueTypes& types,
                               wasm_valtype_vec_t* out) {
  wasm_valtype_vec_new_uninitialized(out, types.size());
  for (size_t i = 0; i < types.size(); ++i) {
    out->data[i] = wasm_valtype_new(FromWabtValueType(types[i]));
  }
}